

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

int __thiscall QAbstractItemView::sizeHintForColumn(QAbstractItemView *this,int column)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  QAbstractItemViewPrivate *pQVar4;
  QWidget *pQVar5;
  int *piVar6;
  long *plVar7;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemDelegate *delegate;
  QWidget *editor;
  int r;
  int rows;
  QAbstractItemViewPrivate *d;
  QModelIndex index;
  int width;
  QStyleOptionViewItem option;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  int iVar8;
  int iVar9;
  QAbstractItemViewPrivate *this_00;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  int local_180;
  int local_15c;
  int local_150;
  undefined8 local_14c;
  int local_144;
  QPersistentModelIndex local_140 [3];
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  QPersistentModelIndex local_110 [3];
  int local_f4;
  QPersistentModelIndex local_f0 [3];
  undefined1 local_d8 [208];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QAbstractItemView *)0x80c7d4);
  bVar2 = true;
  if (-1 < in_ESI) {
    pQVar1 = pQVar4->model;
    in_stack_fffffffffffffe5c = in_ESI;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_f0);
    iVar3 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_f0);
    bVar2 = iVar3 <= in_stack_fffffffffffffe5c;
  }
  if (bVar2) {
    local_15c = -1;
  }
  else {
    QWidget::ensurePolished
              ((QWidget *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    memset(local_d8,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x80c882);
    (**(code **)(*in_RDI + 0x2f8))(in_RDI,local_d8);
    local_f4 = 0;
    this_00 = (QAbstractItemViewPrivate *)pQVar4->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_110);
    iVar3 = (**(code **)(*(long *)&(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                   super_QWidgetPrivate + 0x78))(this_00,local_110);
    for (local_180 = 0; local_180 < iVar3; local_180 = local_180 + 1) {
      local_128 = &DAT_aaaaaaaaaaaaaaaa;
      local_120 = &DAT_aaaaaaaaaaaaaaaa;
      local_118 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = pQVar4->model;
      iVar8 = local_180;
      iVar9 = in_ESI;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_140);
      (**(code **)(*(long *)pQVar1 + 0x60))(&local_128,pQVar1,iVar8,iVar9,local_140);
      QAbstractItemViewPrivate::editorForIndex(this_00,(QModelIndex *)CONCAT44(iVar9,iVar8));
      pQVar5 = QPointer<QWidget>::data((QPointer<QWidget> *)0x80c99e);
      if (pQVar5 != (QWidget *)0x0) {
        local_14c = (**(code **)(*(long *)pQVar5 + 0x70))();
        local_144 = QSize::width((QSize *)0x80c9cb);
        piVar6 = qMax<int>(&local_f4,&local_144);
        local_f4 = *piVar6;
      }
      plVar7 = (long *)(**(code **)(*in_RDI + 0x208))(in_RDI,&local_128);
      if (plVar7 != (long *)0x0) {
        (**(code **)(*plVar7 + 0x68))(plVar7,local_d8,&local_128);
        local_150 = QSize::width((QSize *)0x80ca43);
        piVar6 = qMax<int>(&local_f4,&local_150);
        local_f4 = *piVar6;
      }
    }
    local_15c = local_f4;
    QStyleOptionViewItem::~QStyleOptionViewItem
              ((QStyleOptionViewItem *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_15c;
  }
  __stack_chk_fail();
}

Assistant:

int QAbstractItemView::sizeHintForColumn(int column) const
{
    Q_D(const QAbstractItemView);

    if (column < 0 || column >= d->model->columnCount(d->root))
        return -1;

    ensurePolished();

    QStyleOptionViewItem option;
    initViewItemOption(&option);
    int width = 0;
    int rows = d->model->rowCount(d->root);
    for (int r = 0; r < rows; ++r) {
        const QModelIndex index = d->model->index(r, column, d->root);
        if (QWidget *editor = d->editorForIndex(index).widget.data())
            width = qMax(width, editor->sizeHint().width());
        if (const QAbstractItemDelegate *delegate = itemDelegateForIndex(index))
            width = qMax(width, delegate->sizeHint(option, index).width());
    }
    return width;
}